

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy.h
# Opt level: O0

void __thiscall
disruptor::MultiThreadedStrategy::SynchronizePublishing
          (MultiThreadedStrategy *this,int64_t *sequence,Sequence *cursor,size_t *delta)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  long *in_RCX;
  Sequence *in_RDX;
  Sequence *in_RSI;
  int64_t my_first_sequence;
  
  lVar1 = in_RSI->padding0_[0];
  lVar2 = *in_RCX;
  while( true ) {
    iVar3 = Sequence::sequence(in_RDX);
    if (lVar1 - lVar2 <= iVar3) break;
    std::this_thread::yield();
  }
  Sequence::set_sequence(in_RSI,(int64_t)in_RDX);
  return;
}

Assistant:

void SynchronizePublishing(const int64_t& sequence, Sequence& cursor,
                             const size_t& delta) {
    int64_t my_first_sequence = sequence - delta;

    while (cursor.sequence() < my_first_sequence) {
      // TODO: configurable yield strategy
      std::this_thread::yield();
    }

    cursor.set_sequence(sequence);
  }